

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void countnz(int n,int_t *xprune,int_t *nnzL,int_t *nnzU,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int_t *piVar4;
  int_t *xlsub;
  int *xsup;
  int local_40;
  int_t jlen;
  int j;
  int i;
  int fsupc;
  int nsuper;
  GlobalLU_t *Glu_local;
  int_t *nnzU_local;
  int_t *nnzL_local;
  int_t *xprune_local;
  int n_local;
  
  piVar3 = Glu->xsup;
  piVar4 = Glu->xlsub;
  *nnzL = 0;
  *nnzU = Glu->xusub[n];
  iVar1 = Glu->supno[n];
  if (0 < n) {
    for (jlen = 0; jlen <= iVar1; jlen = jlen + 1) {
      iVar2 = piVar3[jlen];
      xsup._4_4_ = piVar4[iVar2 + 1] - piVar4[iVar2];
      for (local_40 = iVar2; local_40 < piVar3[jlen + 1]; local_40 = local_40 + 1) {
        *nnzL = xsup._4_4_ + *nnzL;
        *nnzU = (local_40 - iVar2) + 1 + *nnzU;
        xsup._4_4_ = xsup._4_4_ + -1;
      }
    }
  }
  return;
}

Assistant:

void
countnz(const int n, int_t *xprune, int_t *nnzL, int_t *nnzU, GlobalLU_t *Glu)
{
    int          nsuper, fsupc, i, j;
    int_t        jlen;
#if ( DEBUGlevel>=1 )
    int_t        irep = 0, nnzL0 = 0;
#endif
    int          *xsup;
    int_t        *xlsub;

    xsup   = Glu->xsup;
    xlsub  = Glu->xlsub;
    *nnzL  = 0;
    *nnzU  = (Glu->xusub)[n];
    nsuper = (Glu->supno)[n];

    if ( n <= 0 ) return;

    /* 
     * For each supernode
     */
    for (i = 0; i <= nsuper; i++) {
	fsupc = xsup[i];
	jlen = xlsub[fsupc+1] - xlsub[fsupc];

	for (j = fsupc; j < xsup[i+1]; j++) {
	    *nnzL += jlen;
	    *nnzU += j - fsupc + 1;
	    jlen--;
	}
#if ( DEBUGlevel>=1 )
        irep = xsup[i+1] - 1;
        nnzL0 += xprune[irep] - xlsub[irep];
#endif
    }

#if ( DEBUGlevel>=1 )
    printf("\tNo of nonzeros in symm-reduced L = %lld\n", (long long) nnzL0); fflush(stdout);
#endif
}